

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_layer_t.h
# Opt level: O0

void __thiscall pool_layer_t::calc_grads(pool_layer_t *this,tensor_t<float> *grad_next_layer)

{
  float *pfVar1;
  long in_RDI;
  int is_max;
  int miny;
  int j;
  int minx;
  int i;
  float sum_error;
  int z;
  range_t rn;
  int y;
  int x;
  int in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  float local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0x44); local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < *(int *)(in_RDI + 0x48); local_18 = local_18 + 1) {
      map_to_output((pool_layer_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x4c); local_34 = local_34 + 1) {
        local_38 = 0.0;
        for (in_stack_ffffffffffffffc4 = local_30; in_stack_ffffffffffffffc4 <= local_24;
            in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc4 * (uint)*(ushort *)(in_RDI + 0x7c);
          for (in_stack_ffffffffffffffbc = local_2c; in_stack_ffffffffffffffbc <= local_20;
              in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
            in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffbc * (uint)*(ushort *)(in_RDI + 0x7c)
            ;
            pfVar1 = tensor_t<float>::operator()
                               ((tensor_t<float> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (int)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
            in_stack_ffffffffffffffa0 = *pfVar1;
            pfVar1 = tensor_t<float>::operator()
                               ((tensor_t<float> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (int)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
            in_stack_ffffffffffffffa4 = (float)(in_stack_ffffffffffffffa0 == *pfVar1);
            pfVar1 = tensor_t<float>::operator()
                               ((tensor_t<float> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (int)in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,0);
            local_38 = in_stack_ffffffffffffffa4 * *pfVar1 + local_38;
          }
        }
        pfVar1 = tensor_t<float>::operator()
                           ((tensor_t<float> *)
                            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            (int)local_38,in_stack_ffffffffffffff98,0);
        *pfVar1 = local_38;
        in_stack_ffffffffffffff9c = local_38;
      }
    }
  }
  return;
}

Assistant:

void calc_grads(tensor_t<float> &grad_next_layer) {
    for (int x = 0; x < in.size.x; x++) {
      for (int y = 0; y < in.size.y; y++) {
        range_t rn = map_to_output(x, y);
        for (int z = 0; z < in.size.z; z++) {
          float sum_error = 0;
          for (int i = rn.min_x; i <= rn.max_x; i++) {
            int minx = i * stride;
            for (int j = rn.min_y; j <= rn.max_y; j++) {
              int miny = j * stride;

              int is_max = in(x, y, z) == out(i, j, z) ? 1 : 0;
              sum_error += is_max * grad_next_layer(i, j, z);
            }
          }
          grads_in(x, y, z) = sum_error;
        }
      }
    }
  }